

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_error_params.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::CertErrorParams2Der::CertErrorParams2Der
          (CertErrorParams2Der *this,char *name1,Input der1,char *name2,Input der2)

{
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  Span<const_unsigned_char> b;
  Span<const_unsigned_char> b_00;
  allocator<char> local_81;
  bssl *local_80;
  uchar *local_78;
  string_view local_70;
  allocator<char> local_5d [13];
  bssl *local_50;
  uchar *local_48;
  string_view local_40;
  char *local_30;
  char *name2_local;
  char *name1_local;
  CertErrorParams2Der *this_local;
  Input der1_local;
  
  der1_local.data_.data_ = (uchar *)der1.data_.size_;
  this_local = (CertErrorParams2Der *)der1.data_.data_;
  local_30 = name2;
  name2_local = name1;
  name1_local = (char *)this;
  CertErrorParams::CertErrorParams(&this->super_CertErrorParams);
  (this->super_CertErrorParams)._vptr_CertErrorParams =
       (_func_int **)&PTR__CertErrorParams2Der_00949750;
  this->name1_ = name2_local;
  Span<unsigned_char_const>::Span<bssl::der::Input,void,bssl::der::Input>
            ((Span<unsigned_char_const> *)&local_50,(Input *)&this_local);
  b.size_ = extraout_RDX;
  b.data_ = local_48;
  local_40 = BytesAsStringView(local_50,b);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->der1_,&local_40,local_5d);
  ::std::allocator<char>::~allocator(local_5d);
  this->name2_ = local_30;
  Span<unsigned_char_const>::Span<bssl::der::Input,void,bssl::der::Input>
            ((Span<unsigned_char_const> *)&local_80,&der2);
  b_00.size_ = extraout_RDX_00;
  b_00.data_ = local_78;
  local_70 = BytesAsStringView(local_80,b_00);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->der2_,&local_70,&local_81);
  ::std::allocator<char>::~allocator(&local_81);
  return;
}

Assistant:

CertErrorParams2Der(const char *name1, der::Input der1, const char *name2,
                      der::Input der2)
      : name1_(name1),
        der1_(BytesAsStringView(der1)),
        name2_(name2),
        der2_(BytesAsStringView(der2)) {}